

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void freeBindings(XML_Parser parser,BINDING *bindings)

{
  binding *pbVar1;
  BINDING *b;
  
  if (bindings != (BINDING *)0x0) {
    do {
      if (parser->m_endNamespaceDeclHandler != (XML_EndNamespaceDeclHandler)0x0) {
        (*parser->m_endNamespaceDeclHandler)(parser->m_handlerArg,bindings->prefix->name);
      }
      pbVar1 = bindings->nextTagBinding;
      bindings->nextTagBinding = parser->m_freeBindingList;
      parser->m_freeBindingList = bindings;
      bindings->prefix->binding = bindings->prevPrefixBinding;
      bindings = pbVar1;
    } while (pbVar1 != (binding *)0x0);
  }
  return;
}

Assistant:

static void
freeBindings(XML_Parser parser, BINDING *bindings)
{
  while (bindings) {
    BINDING *b = bindings;

    /* m_startNamespaceDeclHandler will have been called for this
     * binding in addBindings(), so call the end handler now.
     */
    if (parser->m_endNamespaceDeclHandler)
        parser->m_endNamespaceDeclHandler(parser->m_handlerArg, b->prefix->name);

    bindings = bindings->nextTagBinding;
    b->nextTagBinding = parser->m_freeBindingList;
    parser->m_freeBindingList = b;
    b->prefix->binding = b->prevPrefixBinding;
  }
}